

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

int Gia_ManQuantCheckOverlap(Gia_Man_t *p,int iObj)

{
  ulong *puVar1;
  ulong *puVar2;
  word *pwVar3;
  word *pwVar4;
  ulong uVar5;
  ulong uVar6;
  
  pwVar3 = Gia_ManQuantInfoId(p,iObj);
  pwVar4 = Gia_ManQuantInfoId(p,0);
  uVar5 = (ulong)(uint)p->nSuppWords;
  if (p->nSuppWords < 1) {
    uVar5 = 0;
  }
  uVar6 = 0;
  do {
    if (uVar5 == uVar6) {
      return 0;
    }
    puVar1 = pwVar4 + uVar6;
    puVar2 = pwVar3 + uVar6;
    uVar6 = uVar6 + 1;
  } while ((*puVar2 & *puVar1) == 0);
  return 1;
}

Assistant:

int Gia_ManQuantCheckOverlap( Gia_Man_t * p, int iObj )
{
    return Abc_TtIntersect( Gia_ManQuantInfoId(p, iObj), Gia_ManQuantInfoId(p, 0), p->nSuppWords, 0 );
}